

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool roaring_bitmap_contains_range(roaring_bitmap_t *r,uint64_t range_start,uint64_t range_end)

{
  _Bool _Var1;
  container_t *pcVar2;
  uint32_t local_58;
  uint32_t local_54;
  int32_t i;
  container_t *c;
  uint uStack_40;
  uint8_t type;
  uint32_t lb_re;
  uint32_t lb_rs;
  int32_t ie;
  int32_t is;
  int32_t hlc_sz;
  int32_t span;
  uint16_t hb_re;
  uint16_t hb_rs;
  uint64_t range_end_local;
  uint64_t range_start_local;
  roaring_bitmap_t *r_local;
  
  _span = range_end;
  if (0xffffffff < range_end) {
    _span = 0x100000000;
  }
  if (range_start < _span) {
    range_end_local = range_start;
    range_start_local = (uint64_t)r;
    if (_span - range_start == 1) {
      r_local._7_1_ = roaring_bitmap_contains(r,(uint32_t)range_start);
    }
    else {
      hlc_sz._2_2_ = (ushort)(range_start >> 0x10);
      hlc_sz._0_2_ = (ushort)(_span - 1 >> 0x10);
      is = (uint)(ushort)hlc_sz - (uint)hlc_sz._2_2_;
      ie = ra_get_size(&r->high_low_container);
      if (ie < is + 1) {
        r_local._7_1_ = false;
      }
      else {
        lb_rs = ra_get_index((roaring_array_t *)range_start_local,hlc_sz._2_2_);
        local_58 = ra_get_index((roaring_array_t *)range_start_local,(ushort)hlc_sz);
        if ((int)local_58 < 0) {
          local_58 = 0xffffffff - local_58;
        }
        lb_re = local_58;
        if (((int)lb_rs < 0) || (local_58 - lb_rs != is)) {
          r_local._7_1_ = false;
        }
        else {
          uStack_40 = (uint)range_end_local & 0xffff;
          c._4_4_ = ((int)_span - 1U & 0xffff) + 1;
          pcVar2 = ra_get_container_at_index
                             ((roaring_array_t *)range_start_local,(uint16_t)lb_rs,
                              (uint8_t *)((long)&c + 3));
          if (hlc_sz._2_2_ == (ushort)hlc_sz) {
            r_local._7_1_ = container_contains_range(pcVar2,uStack_40,c._4_4_,c._3_1_);
          }
          else {
            _Var1 = container_contains_range(pcVar2,uStack_40,0x10000,c._3_1_);
            if (_Var1) {
              if (ie <= (int)lb_re) {
                __assert_fail("ie < hlc_sz",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                              ,0x450a,
                              "_Bool roaring_bitmap_contains_range(const roaring_bitmap_t *, uint64_t, uint64_t)"
                             );
              }
              pcVar2 = ra_get_container_at_index
                                 ((roaring_array_t *)range_start_local,(uint16_t)lb_re,
                                  (uint8_t *)((long)&c + 3));
              _Var1 = container_contains_range(pcVar2,0,c._4_4_,c._3_1_);
              local_54 = lb_rs;
              if (_Var1) {
                do {
                  local_54 = local_54 + 1;
                  if ((int)lb_re <= (int)local_54) {
                    return true;
                  }
                  pcVar2 = ra_get_container_at_index
                                     ((roaring_array_t *)range_start_local,(uint16_t)local_54,
                                      (uint8_t *)((long)&c + 3));
                  _Var1 = container_is_full(pcVar2,c._3_1_);
                } while (_Var1);
                r_local._7_1_ = false;
              }
              else {
                r_local._7_1_ = false;
              }
            }
            else {
              r_local._7_1_ = false;
            }
          }
        }
      }
    }
  }
  else {
    r_local._7_1_ = true;
  }
  return r_local._7_1_;
}

Assistant:

bool roaring_bitmap_contains_range(const roaring_bitmap_t *r, uint64_t range_start, uint64_t range_end) {
    if(range_end >= UINT64_C(0x100000000)) {
        range_end = UINT64_C(0x100000000);
    }
    if (range_start >= range_end) return true;  // empty range are always contained!
    if (range_end - range_start == 1) return roaring_bitmap_contains(r, (uint32_t)range_start);
    uint16_t hb_rs = (uint16_t)(range_start >> 16);
    uint16_t hb_re = (uint16_t)((range_end - 1) >> 16);
    const int32_t span = hb_re - hb_rs;
    const int32_t hlc_sz = ra_get_size(&r->high_low_container);
    if (hlc_sz < span + 1) {
      return false;
    }
    int32_t is = ra_get_index(&r->high_low_container, hb_rs);
    int32_t ie = ra_get_index(&r->high_low_container, hb_re);
    ie = (ie < 0 ? -ie - 1 : ie);
    if ((is < 0) || ((ie - is) != span)) {
       return false;
    }
    const uint32_t lb_rs = range_start & 0xFFFF;
    const uint32_t lb_re = ((range_end - 1) & 0xFFFF) + 1;
    uint8_t type;
    container_t *c = ra_get_container_at_index(&r->high_low_container, is,
                                               &type);
    if (hb_rs == hb_re) {
      return container_contains_range(c, lb_rs, lb_re, type);
    }
    if (!container_contains_range(c, lb_rs, 1 << 16, type)) {
      return false;
    }
    assert(ie < hlc_sz); // would indicate an algorithmic bug
    c = ra_get_container_at_index(&r->high_low_container, ie, &type);
    if (!container_contains_range(c, 0, lb_re, type)) {
        return false;
    }
    for (int32_t i = is + 1; i < ie; ++i) {
        c = ra_get_container_at_index(&r->high_low_container, i, &type);
        if (!container_is_full(c, type) ) {
          return false;
        }
    }
    return true;
}